

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_BrDeleteDomain_Test::TestBody
          (InterpreterTestSuite_PC_BrDeleteDomain_Test *this)

{
  Registry *pRVar1;
  Status SVar2;
  string *this_00;
  char *expected_predicate_value;
  char *pcVar3;
  Status local_48a;
  allocator local_489;
  allocator local_488;
  allocator local_487;
  allocator local_486;
  allocator local_485;
  allocator local_484;
  allocator local_483;
  allocator local_482;
  Status local_481;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  string local_448;
  string local_428;
  Expression expr;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3e8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3c8;
  BorderRouterArray bra;
  State local_35c;
  State local_358;
  State local_354;
  string local_350;
  string local_330;
  string local_310;
  UnixTime local_2f0;
  UnixTime local_2e8;
  UnixTime local_2e0;
  Value value;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  bra.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&value,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&bra);
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&bra);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xb0b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&bra);
    this_00 = &value.mError.mMessage;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
    if (bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(bra.
         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
         ._M_impl.super__Vector_impl_data._M_start)->_vptr_BorderRouter[1])();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&value.mError.mMessage);
    pRVar1 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&bra,"127.0.0.1",&local_482);
    local_3c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&expr,"1.1",&local_483);
    ot::commissioner::BorderAgent::State::State(&local_354,0,0,0,0,0);
    std::__cxx11::string::string((string *)&gtest_ar_,"net1",&local_484);
    std::__cxx11::string::string((string *)&local_448,"",&local_485);
    std::__cxx11::string::string((string *)&local_428,"",&local_486);
    std::__cxx11::string::string((string *)&local_310,"",&local_487);
    local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_330,"domain1",&local_488);
    pcVar3 = "";
    std::__cxx11::string::string((string *)&local_350,"",&local_489);
    ot::commissioner::UnixTime::UnixTime(&local_2e0,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)&bra,0x4e21,(ByteArray *)&local_3c8,(string *)&expr,
               local_354,(string *)&gtest_ar_,2,&local_448,&local_428,(Timestamp)0x0,0,&local_310,
               (ByteArray *)&local_3e8,&local_330,'\0',0,&local_350,local_2e0,0x101f);
    local_481 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&value);
    local_48a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar_1,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_481,&local_48a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_330);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&expr);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3c8);
    std::__cxx11::string::~string((string *)&bra);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&value);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bra,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xb0f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
      this_00 = (string *)&gtest_ar_1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
      if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      pRVar1 = ctx.mRegistry;
      std::__cxx11::string::string((string *)&bra,"127.0.0.2",&local_482);
      local_3c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&expr,"1.1",&local_483);
      ot::commissioner::BorderAgent::State::State(&local_358,0,0,0,0,0);
      std::__cxx11::string::string((string *)&gtest_ar_,"net2",&local_484);
      std::__cxx11::string::string((string *)&local_448,"",&local_485);
      std::__cxx11::string::string((string *)&local_428,"",&local_486);
      std::__cxx11::string::string((string *)&local_310,"",&local_487);
      local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_330,"domain2",&local_488);
      pcVar3 = "";
      std::__cxx11::string::string((string *)&local_350,"",&local_489);
      ot::commissioner::UnixTime::UnixTime(&local_2e8,0);
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&value,(string *)&bra,0x4e22,(ByteArray *)&local_3c8,(string *)&expr
                 ,local_358,(string *)&gtest_ar_,1,&local_448,&local_428,(Timestamp)0x0,0,&local_310
                 ,(ByteArray *)&local_3e8,&local_330,'\0',0,&local_350,local_2e8,0x101f);
      local_481 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&value);
      local_48a = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&gtest_ar_1,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_481,&local_48a);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_330);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&expr);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3c8);
      std::__cxx11::string::~string((string *)&bra);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&value);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&bra,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xb13,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
        this_00 = (string *)&gtest_ar_1.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
        if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        pRVar1 = ctx.mRegistry;
        std::__cxx11::string::string((string *)&bra,"127.0.0.3",&local_482);
        local_3c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&expr,"1.1",&local_483);
        ot::commissioner::BorderAgent::State::State(&local_35c,0,0,0,0,0);
        std::__cxx11::string::string((string *)&gtest_ar_,"net1",&local_484);
        std::__cxx11::string::string((string *)&local_448,"",&local_485);
        std::__cxx11::string::string((string *)&local_428,"",&local_486);
        std::__cxx11::string::string((string *)&local_310,"",&local_487);
        local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&local_330,"domain1",&local_488);
        pcVar3 = "";
        std::__cxx11::string::string((string *)&local_350,"",&local_489);
        ot::commissioner::UnixTime::UnixTime(&local_2f0,0);
        expected_predicate_value = (char *)(ulong)(uint)local_35c;
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&value,(string *)&bra,0x4e23,(ByteArray *)&local_3c8,
                   (string *)&expr,local_35c,(string *)&gtest_ar_,2,&local_448,&local_428,
                   (Timestamp)0x0,0,&local_310,(ByteArray *)&local_3e8,&local_330,'\0',0,&local_350,
                   local_2f0,0x101f);
        local_481 = ot::commissioner::persistent_storage::Registry::Add
                              (pRVar1,(BorderAgent *)&value);
        local_48a = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&gtest_ar_1,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.3\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",&local_481,&local_48a);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&local_330);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        std::__cxx11::string::~string((string *)&expr);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3c8);
        std::__cxx11::string::~string((string *)&bra);
        if (gtest_ar_1.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_1.message_);
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          expr.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
          value.mError.mCode = kNone;
          value.mError.mMessage._M_string_length = 0;
          value.mError.mMessage.field_2._M_local_buf[0] = '\0';
          value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
          value.mData._M_string_length = 0;
          value.mData.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string
                    ((string *)&bra,"br delete --dom domain1",(allocator *)&local_448);
          ot::commissioner::Interpreter::ParseExpression
                    ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)&bra);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&expr,&gtest_ar_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
          std::__cxx11::string::~string((string *)&bra);
          ot::commissioner::Interpreter::Eval((Value *)&bra,&ctx.mInterpreter,&expr);
          ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&bra);
          ot::commissioner::Interpreter::Value::~Value((Value *)&bra);
          gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_448);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&bra,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                       "true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_428,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb1e,(char *)bra.
                                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_428,(Message *)&local_448);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
            std::__cxx11::string::~string((string *)&bra);
            if ((long *)local_448._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_448._M_dataplus._M_p + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SVar2 = ot::commissioner::persistent_storage::Registry::GetAllBorderRouters
                            (ctx.mRegistry,&bra);
          local_448._M_dataplus._M_p._0_1_ = SVar2;
          local_428._M_dataplus._M_p._0_4_ = (uint)local_428._M_dataplus._M_p & 0xffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&gtest_ar_,"ctx.mRegistry->GetAllBorderRouters(bra)",
                     "RegistryStatus::kSuccess",(Status *)&local_448,(Status *)&local_428);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_448);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_428,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb20,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_428,(Message *)&local_448);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
            if ((long *)local_448._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_448._M_dataplus._M_p + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          local_448._M_dataplus._M_p =
               (pointer)(((long)bra.
                                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)bra.
                               super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x188);
          local_428._M_dataplus._M_p._0_4_ = 1;
          testing::internal::CmpHelperEQ<unsigned_long,int>
                    ((internal *)&gtest_ar_,"bra.size()","1",(unsigned_long *)&local_448,
                     (int *)&local_428);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_448);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_428,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xb21,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_428,(Message *)&local_448);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
            if ((long *)local_448._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_448._M_dataplus._M_p + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          std::
          vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ::~vector(&bra);
          ot::commissioner::Interpreter::Value::~Value(&value);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&expr);
          goto LAB_0017b17b;
        }
        testing::Message::Message((Message *)&value);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&bra,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xb17,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
        this_00 = (string *)&gtest_ar_1.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
        if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
        }
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
LAB_0017b17b:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrDeleteDomain)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.3", 20003, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("br delete --dom domain1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    BorderRouterArray bra;
    EXPECT_EQ(ctx.mRegistry->GetAllBorderRouters(bra), RegistryStatus::kSuccess);
    EXPECT_EQ(bra.size(), 1);
}